

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  char *pcVar1;
  FILE *pFVar2;
  bool bVar3;
  undefined8 uVar4;
  string *local_3b8;
  bad_alloc *anon_var_0;
  string local_2d0 [39];
  allocator local_2a9;
  string local_2a8 [39];
  allocator local_281;
  string local_280 [39];
  allocator local_259;
  string local_258 [39];
  allocator local_231;
  string local_230 [39];
  allocator local_209;
  string local_208 [32];
  _union_1457 _Stack_1e8;
  sigaction sa;
  string local_148 [8];
  string streamName;
  int local_128;
  allocator local_121;
  int i;
  allocator local_f9;
  string local_f8 [35];
  byte local_d5;
  int local_d4;
  string local_d0 [3];
  bool skipheader;
  int opt;
  string subfolder;
  byte local_a8 [3];
  allocator local_a5 [4];
  bool ordFlag;
  bool outputStreams [2];
  allocator local_91;
  string *local_90;
  string local_88 [32];
  string local_68 [32];
  string asStack_48 [4];
  undefined4 local_44;
  bool abStack_40 [4];
  int maxStreams;
  bool outputFlags [8];
  FILE *fout [2];
  bool local_19;
  bool useReturnPeriodFile;
  char **argv_local;
  int argc_local;
  
  local_19 = false;
  outputFlags[0] = false;
  outputFlags[1] = false;
  outputFlags[2] = false;
  outputFlags[3] = false;
  outputFlags[4] = false;
  outputFlags[5] = false;
  outputFlags[6] = false;
  outputFlags[7] = false;
  _abStack_40 = 0;
  local_44 = 2;
  local_a8[2] = 1;
  local_90 = local_88;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_88,"",&local_91);
  local_90 = local_68;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_68,"",(allocator *)(local_a8 + 3));
  local_a8[2] = 0;
  std::allocator<char>::~allocator((allocator<char> *)(local_a8 + 3));
  std::allocator<char>::~allocator((allocator<char> *)&local_91);
  memset(local_a8,0,2);
  std::__cxx11::string::string(local_d0);
  local_d5 = 0;
  while (local_d4 = getopt(argc,argv,"vhrHFWMSK:fwsmO:o:P:p:"), pcVar1 = _optarg, local_d4 != -1) {
    switch(local_d4) {
    case 0x46:
      _abStack_40 = CONCAT71(stack0xffffffffffffffc1,1);
      local_a8[0] = 1;
      break;
    default:
      help();
      exit(1);
    case 0x48:
      local_d5 = 1;
      break;
    case 0x4b:
      std::__cxx11::string::operator=(local_d0,_optarg);
      break;
    case 0x4d:
      abStack_40 = (bool  [4])CONCAT13(1,abStack_40._0_3_);
      local_a8[0] = 1;
      break;
    case 0x4f:
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_f8,pcVar1,&local_f9);
      openpipe(0,(string *)local_f8,(FILE **)outputFlags);
      std::__cxx11::string::~string(local_f8);
      std::allocator<char>::~allocator((allocator<char> *)&local_f9);
      break;
    case 0x50:
      std::__cxx11::string::operator=(local_88,_optarg);
      break;
    case 0x53:
      abStack_40._0_3_ = CONCAT12(1,abStack_40._0_2_);
      local_a8[0] = 1;
      break;
    case 0x57:
      abStack_40._0_2_ = CONCAT11(1,abStack_40[0]);
      local_a8[1] = 1;
      break;
    case 0x66:
      _abStack_40 = CONCAT14(1,abStack_40);
      local_a8[0] = 1;
      break;
    case 0x68:
      help();
      exit(1);
    case 0x6d:
      _abStack_40 = CONCAT17(1,_abStack_40);
      local_a8[0] = 1;
      break;
    case 0x6f:
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&i,pcVar1,&local_121);
      openpipe(1,(string *)&i,(FILE **)outputFlags);
      std::__cxx11::string::~string((string *)&i);
      std::allocator<char>::~allocator((allocator<char> *)&local_121);
      break;
    case 0x70:
      std::__cxx11::string::operator=(local_68,_optarg);
      break;
    case 0x72:
      local_19 = true;
      break;
    case 0x73:
      _abStack_40 = CONCAT16(1,_abStack_40);
      local_a8[0] = 1;
      break;
    case 0x76:
      fprintf(_stderr,"%s : version: %s\n",*argv,"");
      exit(1);
    case 0x77:
      _abStack_40 = CONCAT15(1,_abStack_40);
      local_a8[1] = 1;
    }
  }
  if (argc == 1) {
    fprintf(_stderr,"FATAL: Invalid parameters\n");
    help();
  }
  local_128 = 0;
  do {
    if (1 < local_128) {
      progname = *argv;
      sa.sa_mask.__val[0xe] = 0;
      sa.sa_mask.__val[0xf] = 0;
      sa.sa_mask.__val[0xc] = 0;
      sa.sa_mask.__val[0xd] = 0;
      sa.sa_mask.__val[10] = 0;
      sa.sa_mask.__val[0xb] = 0;
      sa.sa_mask.__val[8] = 0;
      sa.sa_mask.__val[9] = 0;
      sa.sa_mask.__val[6] = 0;
      sa.sa_mask.__val[7] = 0;
      sa.sa_mask.__val[4] = 0;
      sa.sa_mask.__val[5] = 0;
      sa.sa_mask.__val[2] = 0;
      sa.sa_mask.__val[3] = 0;
      sa.sa_mask.__val[0] = 0;
      sa.sa_mask.__val[1] = 0;
      _Stack_1e8.sa_handler = (__sighandler_t)0x0;
      sa.__sigaction_handler.sa_handler = (__sighandler_t)0x0;
      sa.sa_flags = 0;
      sa._140_4_ = 0;
      sigemptyset((sigset_t *)&sa);
      _Stack_1e8.sa_handler = segfault_sigaction;
      sa.sa_mask.__val[0xf] = CONCAT44(sa.sa_mask.__val[0xf]._4_4_,4);
      sigaction(0xb,(sigaction *)&_Stack_1e8,(sigaction *)0x0);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_208,"",&local_209);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_230,"",&local_231);
      initstreams((string *)local_208,(string *)local_230);
      std::__cxx11::string::~string(local_230);
      std::allocator<char>::~allocator((allocator<char> *)&local_231);
      std::__cxx11::string::~string(local_208);
      std::allocator<char>::~allocator((allocator<char> *)&local_209);
      pcVar1 = progname;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_258,pcVar1,&local_259);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_280,"INFO",&local_281);
      logprintf((string *)local_258,(string *)local_280,"starting process..\n");
      std::__cxx11::string::~string(local_280);
      std::allocator<char>::~allocator((allocator<char> *)&local_281);
      std::__cxx11::string::~string(local_258);
      std::allocator<char>::~allocator((allocator<char> *)&local_259);
      leccalc::doit((string *)local_d0,(FILE **)outputFlags,local_19,(bool)(local_d5 & 1),abStack_40
                    ,true,(string *)local_88,progname);
      pcVar1 = progname;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_2a8,pcVar1,&local_2a9);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_2d0,"INFO",(allocator *)((long)&anon_var_0 + 7));
      logprintf((string *)local_2a8,(string *)local_2d0,"finishing process..\n");
      std::__cxx11::string::~string(local_2d0);
      std::allocator<char>::~allocator((allocator<char> *)((long)&anon_var_0 + 7));
      std::__cxx11::string::~string(local_2a8);
      std::allocator<char>::~allocator((allocator<char> *)&local_2a9);
      anon_var_0._0_4_ = 1;
      std::__cxx11::string::~string(local_d0);
      local_3b8 = asStack_48;
      do {
        local_3b8 = local_3b8 + -0x20;
        std::__cxx11::string::~string(local_3b8);
      } while (local_3b8 != local_88);
      return 0;
    }
    std::__cxx11::string::string(local_148);
    if (local_128 == 0) {
      std::__cxx11::string::operator=(local_148,"EPT");
    }
    else if (local_128 == 1) {
      std::__cxx11::string::operator=(local_148,"PSEPT");
    }
    else {
      std::__cxx11::string::operator=(local_148,"Error");
    }
    if (((local_a8[local_128] & 1) == 0) &&
       ((fout[(long)local_128 + -1] != (FILE *)0x0 ||
        (bVar3 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)(local_88 + (long)local_128 * 0x20),""), bVar3)))) {
      pFVar2 = _stderr;
      uVar4 = std::__cxx11::string::c_str();
      fprintf(pFVar2,"WARNING: no valid output stream to fill %s file.\n",uVar4);
    }
    else if (((local_a8[local_128] & 1) == 1) &&
            ((fout[(long)local_128 + -1] == (FILE *)0x0 &&
             (bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)(local_88 + (long)local_128 * 0x20),""), pFVar2 = _stderr,
             bVar3)))) {
      uVar4 = std::__cxx11::string::c_str();
      fprintf(pFVar2,"FATAL: no destination for %s output.\n",uVar4);
      exit(1);
    }
    bVar3 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            (local_88 + (long)local_128 * 0x20),"");
    if (bVar3) {
      fprintf(_stderr,
              "FATAL: Apache arrow libraries for parquet output are missing.\n Please install libraries and recompile to use this option.\n"
             );
      exit(1);
    }
    std::__cxx11::string::~string(local_148);
    local_128 = local_128 + 1;
  } while( true );
}

Assistant:

int main(int argc, char* argv[])
{
	bool useReturnPeriodFile = false;
	FILE* fout[] = { nullptr, nullptr };
	bool outputFlags[8] = { false, false, false, false,
				false, false, false, false };
	const int maxStreams = 2;
	std::string parquetOutFiles[maxStreams] = { "", "" };
	bool outputStreams[maxStreams] = { false, false };
	const bool ordFlag = true;   // Turn on ORD output

	std::string subfolder;
	int opt;
	bool skipheader = false;
	while ((opt = getopt(argc, argv, "vhrHFWMSK:fwsmO:o:P:p:")) != -1) {
		switch (opt) {
		case 'K':
			subfolder = optarg;
			break;
		case 'H':
			skipheader = true;
			break;
		case 'F':
			outputFlags[AGG_FULL_UNCERTAINTY] = true;
			outputStreams[EPT] = true;
			break;
		case 'f':
			outputFlags[OCC_FULL_UNCERTAINTY] = true;
			outputStreams[EPT] = true;
			break;
		case 'W':
			outputFlags[AGG_WHEATSHEAF] = true;
			outputStreams[PSEPT] = true;
			break;
		case 'w':
			outputFlags[OCC_WHEATSHEAF] = true;
			outputStreams[PSEPT] = true;
			break;
		case 'S':
			outputFlags[AGG_SAMPLE_MEAN] = true;
			outputStreams[EPT] = true;
			break;
		case 's':
			outputFlags[OCC_SAMPLE_MEAN] = true;
			outputStreams[EPT] = true;
			break;
		case 'M':
			outputFlags[AGG_WHEATSHEAF_MEAN] = true;
			outputStreams[EPT] = true;
			break;
		case 'm':
			outputFlags[OCC_WHEATSHEAF_MEAN] = true;
			outputStreams[EPT] = true;
			break;
		case 'r':
			useReturnPeriodFile = true;
			break;
		case 'O':
			openpipe(EPT, optarg, fout);
			break;
		case 'o':
			openpipe(PSEPT, optarg, fout);
			break;
		case 'P':
			parquetOutFiles[EPT] = optarg;
			break;
		case 'p':
			parquetOutFiles[PSEPT] = optarg;
			break;
		case 'v':
#ifdef HAVE_PARQUET
			fprintf(stderr, "%s : version: %s : "
					"Parquet output enabled\n",
				argv[0], VERSION);
#else
			fprintf(stderr, "%s : version: %s\n", argv[0], VERSION);
#endif
			exit(EXIT_FAILURE);
			break;
		case 'h':
			help();
			::exit(EXIT_FAILURE);
			break;
		default:
			help();
			::exit(EXIT_FAILURE);
		}
	}

	if (argc == 1) {
		fprintf(stderr, "FATAL: Invalid parameters\n");
		help();
	}

	// Check for valid combinations of output streams and ORD files
	for (int i = 0; i < maxStreams; i++) {
		std::string streamName;
		if (i == EPT) streamName = "EPT";
		else if (i == PSEPT) streamName = "PSEPT";
		else streamName = "Error";   // Should never get here

		if (outputStreams[i] == false && 
		    (fout[i] != nullptr || parquetOutFiles[i] != "")) {
			fprintf(stderr, "WARNING: no valid output stream to fill %s file.\n",
				streamName.c_str());
		} else if (outputStreams[i] == true && fout[i] == nullptr
			   && parquetOutFiles[i] == "") {
			fprintf(stderr, "FATAL: no destination for %s output.\n",
				streamName.c_str());
			exit(EXIT_FAILURE);
		}
#ifndef HAVE_PARQUET
		if (parquetOutFiles[i] != "") {
			fprintf(stderr, "FATAL: Apache arrow libraries for "
					"parquet output are missing.\n Please "
					"install libraries and recompile to "
					"use this option.\n");
			exit(EXIT_FAILURE);
		}
#endif
	}

	progname = argv[0];
#if !defined(_MSC_VER) && !defined(__MINGW32__)
	struct sigaction sa;

	memset(&sa, 0, sizeof(struct sigaction));
	sigemptyset(&sa.sa_mask);
	sa.sa_sigaction = segfault_sigaction;
	sa.sa_flags = SA_SIGINFO;

	sigaction(SIGSEGV, &sa, NULL);
#endif

	try {
		initstreams();
        	logprintf(progname, "INFO", "starting process..\n");
		leccalc::doit(subfolder, fout, useReturnPeriodFile, skipheader,
			      outputFlags, ordFlag, parquetOutFiles, progname);
        	logprintf(progname, "INFO", "finishing process..\n");
		return EXIT_SUCCESS;
	} catch (std::bad_alloc&) {
		fprintf(stderr, "FATAL: %s: Memory allocation failed\n", progname);
		exit(EXIT_FAILURE);
	}

}